

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNavID(ImGuiID id,int nav_layer)

{
  ImGuiWindow **ppIVar1;
  
  ppIVar1 = &GImGui->NavWindow;
  if (*ppIVar1 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0xa4f,"void ImGui::SetNavID(ImGuiID, int)");
  }
  if ((uint)nav_layer < 2) {
    GImGui->NavId = id;
    (*ppIVar1)->NavLastIds[(uint)nav_layer] = id;
    return;
  }
  __assert_fail("nav_layer == 0 || nav_layer == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0xa50,"void ImGui::SetNavID(ImGuiID, int)");
}

Assistant:

void ImGui::SetNavID(ImGuiID id, int nav_layer)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}